

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void install_stars(void)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  time_t tVar7;
  Am_Value *this;
  float fVar8;
  float fVar9;
  Am_Object local_70;
  Am_Object local_68;
  float local_5c;
  float local_58;
  float color_r;
  float size_r;
  int i;
  Am_Style color;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object star_proto;
  int height;
  int width;
  int top;
  int left;
  Am_Point_List star_pl;
  
  Am_Point_List::Am_Point_List((Am_Point_List *)&top,install_stars::star_ar,0xc);
  Am_Object::Create((char *)&local_38);
  pAVar5 = Am_Point_List::operator_cast_to_Am_Wrapper_((Am_Point_List *)&top);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&local_38,(Am_Wrapper *)0xb2,(ulong)pAVar5);
  Am_Object::Am_Object(&local_30,pAVar6);
  Am_Object::~Am_Object(&local_38);
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  Am_Style::Am_Style((Am_Style *)&size_r);
  for (color_r = 0.0; (int)color_r < 0x3c; color_r = (float)((int)color_r + 1)) {
    iVar3 = rand();
    local_58 = (float)iVar3 * 4.656613e-10;
    iVar3 = rand();
    local_5c = (float)iVar3 * 4.656613e-10;
    star_proto.data._4_4_ = (uint)(local_58 * 20.0);
    star_proto.data._0_4_ = (uint)(local_58 * 20.0);
    iVar3 = rand();
    fVar8 = (float)scrollable_width_init;
    iVar4 = rand();
    fVar9 = (float)scrollable_height_init;
    this = (Am_Value *)Am_Object::Get(0x40a8,0x87);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    if (bVar1) {
      if (0.15 <= local_5c) {
        if (0.3 <= local_5c) {
          if (0.45 <= local_5c) {
            if (0.6 <= local_5c) {
              Am_Style::operator=((Am_Style *)&size_r,(Am_Style *)&Am_White);
            }
            else {
              Am_Style::operator=((Am_Style *)&size_r,(Am_Style *)&Am_Purple);
            }
          }
          else {
            Am_Style::operator=((Am_Style *)&size_r,(Am_Style *)&Am_Blue);
          }
        }
        else {
          Am_Style::operator=((Am_Style *)&size_r,(Am_Style *)&Am_Red);
        }
      }
      else {
        Am_Style::operator=((Am_Style *)&size_r,(Am_Style *)&Am_Yellow);
      }
    }
    else {
      Am_Style::operator=((Am_Style *)&size_r,(Am_Style *)&Am_White);
    }
    Am_Object::Create((char *)&local_70);
    pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&size_r);
    uVar2 = Am_Object::Set((ushort)&local_70,(Am_Wrapper *)0x6b,(ulong)pAVar5);
    uVar2 = Am_Object::Set(uVar2,100,(ulong)(uint)(int)((float)iVar3 * 4.656613e-10 * fVar8));
    uVar2 = Am_Object::Set(uVar2,0x65,(ulong)(uint)(int)((float)iVar4 * 4.656613e-10 * fVar9));
    uVar2 = Am_Object::Set(uVar2,0x66,(ulong)star_proto.data._4_4_);
    pAVar6 = (Am_Object *)Am_Object::Set(uVar2,0x67,(ulong)(uint)star_proto.data);
    Am_Object::Am_Object(&local_68,pAVar6);
    Am_Object::Add_Part((Am_Object *)&SP_Star_Agg,SUB81(&local_68,0),1);
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&local_70);
  }
  Am_Style::~Am_Style((Am_Style *)&size_r);
  Am_Object::~Am_Object(&local_30);
  Am_Point_List::~Am_Point_List((Am_Point_List *)&top);
  return;
}

Assistant:

void
install_stars()
{

  static int star_ar[12] = {100, 0, 159, 181, 5, 69, 195, 69, 41, 181, 100, 0};
  Am_Point_List star_pl(star_ar, 12);
  int left, top, width, height;

  Am_Object star_proto =
      Am_Polygon.Create("SP_Star_Proto").Set(Am_POINT_LIST, star_pl);

  srand((unsigned)time(nullptr)); //init random generator
  Am_Style color;

  for (int i = 0; i < NUM_STARS; i++) {
    float size_r = ((float)rand()) / RAND_MAX;
    float color_r = ((float)rand()) / RAND_MAX;
    width = (int)(size_r * 20);
    height = (int)(size_r * 20);
    left = (int)((((float)rand()) / RAND_MAX) * scrollable_width_init);
    top = (int)((((float)rand()) / RAND_MAX) * scrollable_height_init);
    if (!(bool)Am_Screen.Get(Am_IS_COLOR))
      color = Am_White;
    else if (color_r < 0.15)
      color = Am_Yellow;
    else if (color_r < 0.3)
      color = Am_Red;
    else if (color_r < 0.45)
      color = Am_Blue;
    else if (color_r < 0.6)
      color = Am_Purple;
    else
      color = Am_White;

    SP_Star_Agg.Add_Part(star_proto.Create()
                             .Set(Am_LINE_STYLE, color)
                             .Set(Am_LEFT, left)
                             .Set(Am_TOP, top)
                             .Set(Am_WIDTH, width)
                             .Set(Am_HEIGHT, height));
  }
}